

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_set_var_test(void)

{
  code *pcVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  long lVar3;
  undefined2 uVar4;
  undefined1 *puVar5;
  int iVar6;
  uint uVar7;
  btree_kv_ops *pbVar8;
  ulong uVar9;
  undefined8 uStackY_140;
  undefined1 local_138 [8];
  void *in_stack_fffffffffffffed0;
  key_len_t in_stack_fffffffffffffede;
  char *in_stack_fffffffffffffee0;
  void *vars [2];
  char acStack_a0 [6];
  key_len_t str_len;
  char str [11];
  idx_t idx;
  undefined8 uStack_88;
  int cmp;
  uint64_t v;
  int level;
  uint8_t vsize;
  uint8_t ksize;
  void *value;
  void *key;
  btree_kv_ops *kv_ops;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStackY_140 = 0x101f18;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStackY_140 = 0x101f25;
  memleak_start();
  _acStack_a0 = 0x72747374736574;
  stack0xffffffffffffff67 = 0x676e69;
  v._6_1_ = 8;
  uStack_88 = 10;
  uStackY_140 = 0x101f6c;
  construct_key_ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffede,in_stack_fffffffffffffed0);
  lVar3 = -(ulong)(v._6_1_ + 0xf & 0xfffffff0);
  uVar9 = (ulong)v._6_1_;
  _level = local_138 + lVar3;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x101f96;
  memset(local_138 + lVar3,0,uVar9);
  puVar5 = _level;
  uVar9 = (ulong)v._6_1_;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x101fa9;
  memcpy(puVar5,&stack0xffffffffffffff78,uVar9);
  key = local_138;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x101fbd;
  btree_str_kv_get_kb64_vb64(*(btree_kv_ops **)(&stack0xfffffffffffffed0 + lVar3));
  stack0xffffffffffffff72 = 0;
  v._0_4_ = 1;
  v._7_1_ = 0xd;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x101ff2;
  pbVar8 = (btree_kv_ops *)
           dummy_node((&stack0xfffffffffffffed7)[lVar3],(&stack0xfffffffffffffed6)[lVar3],
                      *(uint16_t *)(&stack0xfffffffffffffed4 + lVar3));
  puVar5 = _level;
  uVar4 = stack0xffffffffffffff72;
  pcVar1 = *(code **)((long)key + 8);
  kv_ops = pbVar8;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x102016;
  (*pcVar1)(pbVar8,uVar4,&value,puVar5);
  p_Var2 = kv_ops->set_kv;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x10202e;
  iVar6 = strcmp((char *)(p_Var2 + 2),acStack_a0);
  if (iVar6 != 0) {
    *(undefined8 *)(local_138 + lVar3 + -8) = 0x102061;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xf1);
    kv_set_var_test::__test_pass = 0;
    if (iVar6 != 0) {
      *(undefined8 *)(local_138 + lVar3 + -8) = 0x102095;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0xf1,"void kv_set_var_test()");
    }
  }
  puVar5 = _level;
  p_Var2 = kv_ops->set_kv;
  uVar7 = (uint)v._7_1_;
  uVar9 = (ulong)v._6_1_;
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x1020b7;
  iVar6 = memcmp(p_Var2 + (int)uVar7,puVar5,uVar9);
  if (iVar6 != 0) {
    *(undefined8 *)(local_138 + lVar3 + -8) = 0x1020ea;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0xf3);
    kv_set_var_test::__test_pass = 0;
    if (iVar6 != 0) {
      *(undefined8 *)(local_138 + lVar3 + -8) = 0x10211e;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0xf3,"void kv_set_var_test()");
    }
  }
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x102147;
  freevars(*(void ***)(&stack0xfffffffffffffee0 + lVar3),
           *(size_t *)(&stack0xfffffffffffffed8 + lVar3));
  *(undefined8 *)(local_138 + lVar3 + -8) = 0x10214c;
  memleak_end();
  if (kv_set_var_test::__test_pass == 0) {
    *(undefined8 *)(local_138 + lVar3 + -8) = 0x102195;
    fprintf(_stderr,"%s FAILED\n","kv set var test");
  }
  else {
    *(undefined8 *)(local_138 + lVar3 + -8) = 0x102174;
    fprintf(_stderr,"%s PASSED\n","kv set var test");
  }
  return;
}

Assistant:

void kv_set_var_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    void *key, *value;
    uint8_t ksize, vsize;
    int level;
    uint64_t v;
    int cmp;
    idx_t idx;
    char str[] = "teststring";
    key_len_t str_len = sizeof(str);

    vsize = sizeof(v);
    v = 10;

    construct_key_ptr(str, str_len, &key);
    value = alca(uint8_t, vsize);
    memset(value, 0, vsize);
    memcpy(value, &v, vsize);

    // init ops
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set key/value in node
    idx = 0;
    level = 1;
    ksize = str_len + sizeof(key_len_t);
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, &key, value);

    // verify node->data
    cmp = strcmp((char *)((uint8_t *)node->data + sizeof(key_len_t)), str);
    TEST_CHK(cmp == 0);
    cmp = memcmp((uint8_t *)node->data + ksize, value, vsize);
    TEST_CHK(cmp == 0);

    void *vars[] = {node, key};
    freevars(vars, sizeof(vars)/sizeof(void *));

    memleak_end();
    TEST_RESULT("kv set var test");
}